

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# circular_q.h
# Opt level: O2

void __thiscall
spdlog::details::circular_q<spdlog::details::log_msg_buffer>::copy_moveable
          (circular_q<spdlog::details::log_msg_buffer> *this,
          circular_q<spdlog::details::log_msg_buffer> *other)

{
  undefined4 uVar1;
  undefined4 uVar2;
  size_type sVar3;
  size_t sVar4;
  
  sVar3 = other->head_;
  this->max_items_ = other->max_items_;
  this->head_ = sVar3;
  uVar1 = *(undefined4 *)((long)&other->tail_ + 4);
  sVar4 = other->overrun_counter_;
  uVar2 = *(undefined4 *)((long)&other->overrun_counter_ + 4);
  *(int *)&this->tail_ = (int)other->tail_;
  *(undefined4 *)((long)&this->tail_ + 4) = uVar1;
  *(int *)&this->overrun_counter_ = (int)sVar4;
  *(undefined4 *)((long)&this->overrun_counter_ + 4) = uVar2;
  std::vector<spdlog::details::log_msg_buffer,_std::allocator<spdlog::details::log_msg_buffer>_>::
  _M_move_assign(&this->v_,&other->v_);
  other->tail_ = 0;
  other->overrun_counter_ = 0;
  other->max_items_ = 0;
  other->head_ = 0;
  return;
}

Assistant:

void copy_moveable(circular_q &&other) SPDLOG_NOEXCEPT
    {
        max_items_ = other.max_items_;
        head_ = other.head_;
        tail_ = other.tail_;
        overrun_counter_ = other.overrun_counter_;
        v_ = std::move(other.v_);

        // put &&other in disabled, but valid state
        other.max_items_ = 0;
        other.head_ = other.tail_ = 0;
        other.overrun_counter_ = 0;
    }